

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::StringMaker<long_long,void>::convert_abi_cxx11_
          (string *__return_storage_ptr__,StringMaker<long_long,void> *this,longlong value)

{
  ReusableStringStream rss;
  
  ReusableStringStream::ReusableStringStream(&rss);
  std::ostream::_M_insert<long_long>((longlong)rss.m_oss);
  if (0xff < (long)this) {
    std::operator<<((ostream *)rss.m_oss," (0x");
    *(uint *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x18) =
         *(uint *)(rss.m_oss + *(long *)(*(long *)rss.m_oss + -0x18) + 0x18) & 0xffffffb5 | 8;
    std::ostream::_M_insert<long_long>((longlong)rss.m_oss);
    std::operator<<((ostream *)rss.m_oss,')');
  }
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&rss);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<long long>::convert(long long value) {
    ReusableStringStream rss;
    rss << value;
    if (value > Detail::hexThreshold) {
        rss << " (0x" << std::hex << value << ')';
    }
    return rss.str();
}